

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_pollq_epoll.c
# Opt level: O2

void nni_epoll_thr(void *arg)

{
  char cVar1;
  long lVar2;
  uint64_t list;
  uint uVar3;
  int *piVar4;
  void *item;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 local_358 [8];
  epoll_event events [64];
  undefined1 local_50 [8];
  uint64_t clear;
  nni_cv *local_40;
  nni_mtx *local_38;
  
  clear = (long)arg + 0x108;
  local_40 = (nni_cv *)((long)arg + 0x28);
  local_38 = (nni_mtx *)arg;
  do {
    do {
      uVar3 = epoll_wait(local_38[2].mtx.__data.__kind,(epoll_event *)local_358,0x40,-1);
      if (((int)uVar3 < 0) && (piVar4 = __errno_location(), *piVar4 == 9)) {
        return;
      }
      uVar7 = 0;
      uVar6 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar6 = uVar7;
      }
      bVar5 = false;
      for (; uVar6 * 0xc - uVar7 != 0; uVar7 = uVar7 + 0xc) {
        lVar2 = *(long *)(local_358 + uVar7 + 4);
        if ((*(uint *)(local_358 + uVar7) & 1) == 0 || lVar2 != 0) {
          uVar3 = *(uint *)(local_358 + uVar7) & 0x1d;
          nni_atomic_and((nni_atomic_int *)(lVar2 + 0x30),~uVar3);
          (**(code **)(lVar2 + 0x20))(*(undefined8 *)(lVar2 + 0x28),uVar3);
        }
        else {
          read(*(int *)((long)&local_38[2].mtx + 0x14),local_50,8);
          bVar5 = true;
        }
      }
    } while (!bVar5);
    nni_mtx_lock(local_38);
    list = clear;
    while (item = nni_list_first((nni_list *)list), item != (void *)0x0) {
      nni_list_remove((nni_list *)list,item);
    }
    nni_cv_wake(local_40);
    cVar1 = local_38[2].mtx.__size[0x18];
    nni_mtx_unlock(local_38);
  } while (cVar1 != '\x01');
  return;
}

Assistant:

static void
nni_epoll_thr(void *arg)
{
	nni_posix_pollq   *pq = arg;
	struct epoll_event events[NNI_MAX_EPOLL_EVENTS];

	for (;;) {
		int  n;
		bool reap = false;

		n = epoll_wait(pq->epfd, events, NNI_MAX_EPOLL_EVENTS, -1);
		if ((n < 0) && (errno == EBADF)) {
			// Epoll fd closed, bail.
			return;
		}

		// dispatch events
		for (int i = 0; i < n; ++i) {
			const struct epoll_event *ev;

			ev = &events[i];
			// If the waker pipe was signaled, read from it.
			if ((ev->data.ptr == NULL) &&
			    (ev->events & (unsigned) POLLIN)) {
				uint64_t clear;
				(void) read(pq->evfd, &clear, sizeof(clear));
				reap = true;
			} else {
				nni_posix_pfd *pfd = ev->data.ptr;
				unsigned       mask;

				mask = ev->events &
				    ((unsigned) (EPOLLIN | EPOLLOUT |
				        EPOLLERR | EPOLLHUP));

				nni_atomic_and(&pfd->events, (int) ~mask);

				// Execute the callback with lock released
				pfd->cb(pfd->arg, mask);
			}
		}

		if (reap) {
			nni_mtx_lock(&pq->mtx);
			nni_posix_pollq_reap(pq);
			if (pq->close) {
				nni_mtx_unlock(&pq->mtx);
				return;
			}
			nni_mtx_unlock(&pq->mtx);
		}
	}
}